

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.c
# Opt level: O0

void wp_trace_pool_insert_data
               (wp_trace_idx *idx_pool,void *data_pool,size_t pool_capacity,size_t data_size,
               void *key,void *data)

{
  wp_trace_idx *pwVar1;
  void *data_it;
  wp_trace_idx *idx;
  size_t i;
  void *data_local;
  void *key_local;
  size_t data_size_local;
  size_t pool_capacity_local;
  void *data_pool_local;
  wp_trace_idx *idx_pool_local;
  
  if (idx_pool == (wp_trace_idx *)0x0) {
    w_handle_failed_assertion
              ("idx_pool != NULL","wp_trace_pool_insert_data",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/trace.c"
               ,0x19);
  }
  if (data_pool == (void *)0x0) {
    w_handle_failed_assertion
              ("data_pool != NULL","wp_trace_pool_insert_data",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/trace.c"
               ,0x1a);
  }
  if (key == (void *)0x0) {
    w_handle_failed_assertion
              ("key != NULL","wp_trace_pool_insert_data",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/trace.c"
               ,0x1b);
  }
  if (data == (void *)0x0) {
    w_handle_failed_assertion
              ("data != NULL","wp_trace_pool_insert_data",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/trace.c"
               ,0x1c);
  }
  idx = (wp_trace_idx *)0x0;
  while( true ) {
    if (pool_capacity <= idx) {
      w_handle_failed_assertion
                ("0","wp_trace_pool_insert_data",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/trace.c"
                 ,0x30);
      return;
    }
    pwVar1 = idx_pool + (long)idx;
    if (pwVar1->valid == 0) break;
    idx = (wp_trace_idx *)((long)&idx->key + 1);
  }
  pwVar1->key = key;
  pwVar1->valid = 1;
  w_copy_mem((void *)((long)data_pool + data_size * (long)idx),data,data_size);
  return;
}

Assistant:

void
wp_trace_pool_insert_data(
    struct wp_trace_idx *idx_pool,
    void *data_pool,
    size_t pool_capacity,
    size_t data_size,
    const void *key,
    const void *data
)
{
    size_t i;

    W_ASSERT(idx_pool != NULL);
    W_ASSERT(data_pool != NULL);
    W_ASSERT(key != NULL);
    W_ASSERT(data != NULL);

    for (i = 0; i < pool_capacity; ++i)
    {
        struct wp_trace_idx *idx;

        idx = &idx_pool[i];
        if (!idx->valid)
        {
            void *data_it;

            data_it = (void *)((uintptr_t)data_pool + data_size * i);

            idx->key = key;
            idx->valid = 1;
            w_copy_mem(data_it, data, data_size);
            return;
        }
    }

    W_ASSERT(0);
}